

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_sgetc(ztlex_t *lex)

{
  size_t sVar1;
  int c;
  ztlex_t *lex_local;
  int local_4;
  
  if (lex->index == lex->length) {
    local_4 = -1;
  }
  else {
    sVar1 = lex->index;
    lex->index = sVar1 + 1;
    local_4 = (int)lex->string[sVar1];
    if (local_4 == 10) {
      lex->line = lex->line + 1;
      lex->prevcolumn = lex->column;
      lex->column = 1;
    }
    else {
      lex->column = lex->column + 1;
    }
  }
  return local_4;
}

Assistant:

static int ztlex_sgetc(ztlex_t *lex)
{
  int c;

  assert(lex->string);
  assert(lex->index <= lex->length);

  if (lex->index == lex->length)
    return EOF;

  c = lex->string[lex->index++];
  if (c == '\n')
  {
    lex->line++;
    lex->prevcolumn = lex->column;
    lex->column = 1;
  }
  else
  {
    lex->column++;
  }

  return c;
}